

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O3

int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Nm_Man_t *p;
  Abc_Obj_t *pObj_00;
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcCheck.c"
                  ,0x3a0,"int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *)");
  }
  pVVar3 = pNtk->vCos;
  if (pVVar3->nSize < 1) {
    iVar6 = 1;
  }
  else {
    iVar6 = 1;
    lVar7 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar7];
      p = pNtk->pManName;
      pcVar4 = Abc_ObjName(pObj);
      uVar1 = Nm_ManFindIdByNameTwoTypes(p,pcVar4,2,5);
      if (uVar1 != 0xffffffff) {
        if (((int)uVar1 < 0) || (pNtk->vObjs->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar1];
        pcVar4 = Abc_ObjName(pObj);
        pcVar5 = Abc_ObjName(pObj_00);
        iVar2 = strcmp(pcVar4,pcVar5);
        if (iVar2 != 0) {
          __assert_fail("!strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcCheck.c"
                        ,0x3a7,"int Abc_NtkCheckUniqueCioNames(Abc_Ntk_t *)");
        }
        if ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] != pObj_00) {
          pcVar4 = Abc_ObjName(pObj);
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
          iVar6 = 0;
          printf("Abc_NtkCheck: A CI/CO pair share the name (%s) but do not link directly. The name of the CO fanin is %s.\n"
                 ,pcVar4,pcVar5);
        }
      }
      lVar7 = lVar7 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar7 < pVVar3->nSize);
  }
  return iVar6;
}

Assistant:

int Abc_NtkCheckUniqueCioNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pObjCi, * pFanin;
    int i, nCiId, fRetValue = 1;
    assert( !Abc_NtkIsNetlist(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        nCiId = Nm_ManFindIdByNameTwoTypes( pNtk->pManName, Abc_ObjName(pObj), ABC_OBJ_PI, ABC_OBJ_BO );
        if ( nCiId == -1 )
            continue;
        pObjCi = Abc_NtkObj( pNtk, nCiId );
        assert( !strcmp( Abc_ObjName(pObj), Abc_ObjName(pObjCi) ) );
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin != pObjCi )
        {
            printf( "Abc_NtkCheck: A CI/CO pair share the name (%s) but do not link directly. The name of the CO fanin is %s.\n", 
                Abc_ObjName(pObj), Abc_ObjName(Abc_ObjFanin0(pObj)) );
            fRetValue = 0;
        }
    }
    return fRetValue;
}